

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_conn_forget_socket(Curl_easy *data,int sockindex)

{
  connectdata *pcVar1;
  
  pcVar1 = data->conn;
  if (pcVar1 != (connectdata *)0x0) {
    if (pcVar1->cfilter[sockindex] != (Curl_cfilter *)0x0) {
      Curl_conn_cf_cntrl(pcVar1->cfilter[sockindex],data,true,0x101,0,(void *)0x0);
      pcVar1 = data->conn;
    }
    pcVar1->sock[sockindex] = -1;
  }
  return;
}

Assistant:

void Curl_conn_forget_socket(struct Curl_easy *data, int sockindex)
{
  if(data->conn) {
    struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
    if(cf)
      (void)Curl_conn_cf_cntrl(cf, data, TRUE,
                               CF_CTRL_FORGET_SOCKET, 0, NULL);
    fake_sclose(data->conn->sock[sockindex]);
    data->conn->sock[sockindex] = CURL_SOCKET_BAD;
  }
}